

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

char_t * pugi::impl::anon_unknown_0::find_substring(char_t *s,char_t *p)

{
  char *pcVar1;
  char *in_RSI;
  char *in_RDI;
  
  pcVar1 = strstr(in_RDI,in_RSI);
  return pcVar1;
}

Assistant:

PUGI_IMPL_FN const char_t* find_substring(const char_t* s, const char_t* p)
	{
	#ifdef PUGIXML_WCHAR_MODE
		// MSVC6 wcsstr bug workaround (if s is empty it always returns 0)
		return (*p == 0) ? s : wcsstr(s, p);
	#else
		return strstr(s, p);
	#endif
	}